

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_DefaultsFarFuture_Test::
~FeatureResolverTest_DefaultsFarFuture_Test(FeatureResolverTest_DefaultsFarFuture_Test *this)

{
  FeatureResolverTest_DefaultsFarFuture_Test *this_local;
  
  ~FeatureResolverTest_DefaultsFarFuture_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FeatureResolverTest, DefaultsFarFuture) {
  absl::StatusOr<FeatureSet> merged =
      GetDefaults(EDITION_99999_TEST_ONLY, pb::test);
  ASSERT_OK(merged);

  pb::TestFeatures ext = merged->GetExtension(pb::test);
  EXPECT_EQ(ext.file_feature(), pb::VALUE5);
  EXPECT_TRUE(ext.bool_field_feature());
}